

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
__thiscall
duckdb::ParquetWriteInitializeGlobal
          (duckdb *this,ClientContext *context,FunctionData *bind_data,string *file_path)

{
  _Head_base<0UL,_duckdb::ParquetWriter_*,_false> __p;
  __uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  _Var1;
  pointer pPVar2;
  unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>_>
  local_68;
  __uniq_ptr_impl<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>_>
  local_60;
  _Head_base<0UL,_duckdb::ParquetWriter_*,_false> local_58;
  FunctionData *local_50;
  __uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  local_48;
  FileSystem *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  make_uniq<duckdb::ParquetWriteGlobalState>();
  local_40 = FileSystem::GetFileSystem(context);
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>)
       (tuple<duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>)this;
  local_38 = file_path;
  ChildFieldIDs::Copy((ChildFieldIDs *)&local_68);
  local_50 = bind_data + 10;
  make_uniq<duckdb::ParquetWriter,duckdb::ClientContext&,duckdb::FileSystem&,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb_parquet::CompressionCodec::type&,duckdb::ChildFieldIDs,duckdb::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,true>&,duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>&,unsigned_long&,unsigned_long&,double&,long&,bool&,duckdb::ParquetVersion&>
            ((duckdb *)&local_58,context,local_40,local_38,
             (vector<duckdb::LogicalType,_true> *)(bind_data + 4),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(bind_data + 7),(type *)local_50,(ChildFieldIDs *)&local_68,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              *)(bind_data + 0xb),
             (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)(bind_data + 0x10),
             (unsigned_long *)(bind_data + 0x13),(unsigned_long *)(bind_data + 0x14),
             (double *)(bind_data + 0x15),(long *)(bind_data + 0x18),(bool *)(bind_data + 0x12),
             (ParquetVersion *)(bind_data + 0x19));
  pPVar2 = unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
                         *)&local_60);
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
       .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
  __p._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (ParquetWriter *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_>::reset
            ((__uniq_ptr_impl<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_> *)
             &pPVar2->writer,__p._M_head_impl);
  ::std::unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_>::~unique_ptr
            ((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>_> *)
             &local_58);
  ::std::
  unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>_>
  ::~unique_ptr(&local_68);
  *(tuple<duckdb::ParquetWriteGlobalState_*,_std::default_delete<duckdb::ParquetWriteGlobalState>_>
    *)_Var1._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
      .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       local_60._M_t.
       super__Tuple_impl<0UL,_duckdb::ParquetWriteGlobalState_*,_std::default_delete<duckdb::ParquetWriteGlobalState>_>
       .super__Head_base<0UL,_duckdb::ParquetWriteGlobalState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
           .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalFunctionData> ParquetWriteInitializeGlobal(ClientContext &context, FunctionData &bind_data,
                                                            const string &file_path) {
	auto global_state = make_uniq<ParquetWriteGlobalState>();
	auto &parquet_bind = bind_data.Cast<ParquetWriteBindData>();

	auto &fs = FileSystem::GetFileSystem(context);
	global_state->writer = make_uniq<ParquetWriter>(
	    context, fs, file_path, parquet_bind.sql_types, parquet_bind.column_names, parquet_bind.codec,
	    parquet_bind.field_ids.Copy(), parquet_bind.kv_metadata, parquet_bind.encryption_config,
	    parquet_bind.dictionary_size_limit, parquet_bind.string_dictionary_page_size_limit,
	    parquet_bind.bloom_filter_false_positive_ratio, parquet_bind.compression_level, parquet_bind.debug_use_openssl,
	    parquet_bind.parquet_version);
	return std::move(global_state);
}